

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider __s1;
  size_type __n;
  int iVar2;
  int iVar3;
  char *pcVar4;
  string *psVar5;
  size_t sVar6;
  ostream *poVar7;
  long *plVar8;
  iterator iVar9;
  long lVar10;
  long lVar11;
  int idx;
  string chosenString;
  string retKey;
  string retrieved;
  string randomValue;
  string retValue;
  string key;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keyValueStore;
  string *stringPtrArray [65000];
  key_type kStack_7f098;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_7f078;
  char *pcStack_7f038;
  long lStack_7f030;
  char cStack_7f028;
  undefined7 uStack_7f027;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_7f018;
  undefined8 uStack_7eff8;
  long *plStack_7eff0;
  long lStack_7efe8;
  long alStack_7efe0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_7efd0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  _Stack_7efb0;
  undefined8 *apuStack_7ef78 [65001];
  
  kStack_7f098._M_dataplus._M_p = (pointer)&kStack_7f098.field_2;
  kStack_7f098._M_string_length = 0;
  kStack_7f098.field_2._M_local_buf[0] = '\0';
  lVar11 = 0;
  std::chrono::_V2::steady_clock::now();
  do {
    pcVar4 = (char *)operator_new__(0x21);
    lVar10 = 0;
    do {
      iVar2 = rand();
      pcVar4[lVar10] = (char)iVar2 + (char)(iVar2 / 0x1a) * -0x1a + 'a';
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x20);
    pcVar4[0x20] = '\0';
    psVar5 = (string *)operator_new(0x20);
    *(string **)psVar5 = psVar5 + 0x10;
    sVar6 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>(psVar5,pcVar4,pcVar4 + sVar6);
    apuStack_7ef78[lVar11] = (undefined8 *)psVar5;
    if (lVar11 == 0xbe6f) {
      std::__cxx11::string::_M_assign((string *)&kStack_7f098);
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 65000);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Storage: Time difference = ",0x1b);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ms]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Storage: Time difference = ",0x1b);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,anon_var_dwarf_51ec,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Storage: Time difference = ",0x1b);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ns]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::chrono::_V2::steady_clock::now();
  __n = kStack_7f098._M_string_length;
  __s1._M_p = kStack_7f098._M_dataplus._M_p;
  lVar11 = 0;
  do {
    if (__n == apuStack_7ef78[lVar11][1]) {
      if (__n == 0) goto LAB_001025de;
      iVar2 = bcmp(__s1._M_p,(void *)*apuStack_7ef78[lVar11],__n);
      if (iVar2 == 0) goto LAB_001025de;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 65000);
  lVar11 = 0xffffffff;
LAB_001025de:
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value at 0: ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*apuStack_7ef78[0],apuStack_7ef78[0][1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Value at 1: ",0xc);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)*apuStack_7ef78[1],apuStack_7ef78[1][1]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieved         : ",0x14);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,kStack_7f098._M_dataplus._M_p,
                      kStack_7f098._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," at index: ",0xb);
  plVar8 = (long *)std::ostream::operator<<(poVar7,(int)lVar11);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by name : Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ms]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by name : Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,anon_var_dwarf_51ec,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by name : Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ns]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  pcStack_7f038 = &cStack_7f028;
  lStack_7f030 = 0;
  cStack_7f028 = '\0';
  std::chrono::_V2::steady_clock::now();
  std::__cxx11::string::_M_assign((string *)&pcStack_7f038);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieved         : ",0x14);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,pcStack_7f038,lStack_7f030);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by index: Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ms]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by index: Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,anon_var_dwarf_51ec,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieval by index: Time difference = ",0x26);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ns]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  _Stack_7efb0._M_buckets = &_Stack_7efb0._M_single_bucket;
  _Stack_7efb0._M_bucket_count = 1;
  _Stack_7efb0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  _Stack_7efb0._M_element_count = 0;
  _Stack_7efb0._M_rehash_policy._M_max_load_factor = 1.0;
  _Stack_7efb0._M_rehash_policy._M_next_resize = 0;
  _Stack_7efb0._M_single_bucket = (__node_base_ptr)0x0;
  bStack_7efd0._M_dataplus._M_p = (pointer)&bStack_7efd0.field_2;
  bStack_7efd0._M_string_length = 0;
  bStack_7efd0.field_2._M_local_buf[0] = '\0';
  bStack_7f018._M_dataplus._M_p = (pointer)&bStack_7f018.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&bStack_7f018,"wibble","");
  uStack_7eff8 = std::chrono::_V2::steady_clock::now();
  iVar2 = 0;
  do {
    pcVar4 = (char *)operator_new__(0x21);
    lVar11 = 0;
    do {
      iVar3 = rand();
      pcVar4[lVar11] = (char)iVar3 + (char)(iVar3 / 0x1a) * -0x1a + 'a';
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x20);
    pcVar4[0x20] = '\0';
    paVar1 = &pStack_7f078.first.field_2;
    pStack_7f078.first._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&pStack_7f078,pcVar4,pcVar4 + sVar6);
    std::__cxx11::string::operator=((string *)&bStack_7efd0,(string *)&pStack_7f078);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pStack_7f078.first._M_dataplus._M_p != paVar1) {
      operator_delete(pStack_7f078.first._M_dataplus._M_p,
                      pStack_7f078.first.field_2._M_allocated_capacity + 1);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&pStack_7f078,&bStack_7efd0,&bStack_7f018);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&_Stack_7efb0,&pStack_7f078);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pStack_7f078.second._M_dataplus._M_p != &pStack_7f078.second.field_2) {
      operator_delete(pStack_7f078.second._M_dataplus._M_p,
                      pStack_7f078.second.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pStack_7f078.first._M_dataplus._M_p != paVar1) {
      operator_delete(pStack_7f078.first._M_dataplus._M_p,
                      pStack_7f078.first.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == 0xbe6f) {
      std::__cxx11::string::_M_assign((string *)&kStack_7f098);
    }
    iVar2 = iVar2 + 1;
  } while (iVar2 != 65000);
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MapStore: Time difference = ",0x1c);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ms]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MapStore: Time difference = ",0x1c);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,anon_var_dwarf_51ec,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"MapStore: Time difference = ",0x1c);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ns]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::chrono::_V2::steady_clock::now();
  iVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&_Stack_7efb0,&kStack_7f098);
  pStack_7f078.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pStack_7f078,
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 8),
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x10) +
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 8));
  plStack_7eff0 = alStack_7efe0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&plStack_7eff0,
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28),
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x30) +
             *(long *)((long)iVar9.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x28));
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieved key    : ",0x13);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,pStack_7f078.first._M_dataplus._M_p,
                      pStack_7f078.first._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," with value: ",0xd);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)plStack_7eff0,lStack_7efe8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve from Map: Time difference = ",0x25);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ms]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve from Map: Time difference = ",0x25);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,anon_var_dwarf_51ec,5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Retrieve from Map: Time difference = ",0x25);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[ns]",4);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (plStack_7eff0 != alStack_7efe0) {
    operator_delete(plStack_7eff0,alStack_7efe0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pStack_7f078.first._M_dataplus._M_p != &pStack_7f078.first.field_2) {
    operator_delete(pStack_7f078.first._M_dataplus._M_p,
                    pStack_7f078.first.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_7f018._M_dataplus._M_p != &bStack_7f018.field_2) {
    operator_delete(bStack_7f018._M_dataplus._M_p,bStack_7f018.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bStack_7efd0._M_dataplus._M_p != &bStack_7efd0.field_2) {
    operator_delete(bStack_7efd0._M_dataplus._M_p,
                    CONCAT71(bStack_7efd0.field_2._M_allocated_capacity._1_7_,
                             bStack_7efd0.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&_Stack_7efb0);
  if (pcStack_7f038 != &cStack_7f028) {
    operator_delete(pcStack_7f038,CONCAT71(uStack_7f027,cStack_7f028) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)kStack_7f098._M_dataplus._M_p != &kStack_7f098.field_2) {
    operator_delete(kStack_7f098._M_dataplus._M_p,
                    CONCAT71(kStack_7f098.field_2._M_allocated_capacity._1_7_,
                             kStack_7f098.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main()
{
  // Store 65 000 items in memory of random length
  //  (max 16 letters @ 8 bits per char = 128 bits)
  //  (max 128 letters @ 8 bits per char = 1024 bits)
  // QUIZ: Why not 100 000 above?
  char* buffer;
  int bufferLength = 32;

  const int storeSize = 65000; // Number of records in our 'database'



  // OPTION 1: Store unsorted

  const unsigned short int chosen = (storeSize / 4) * 3 + 1;
  std::string chosenString;
  std::string* stringPtrArray[storeSize]; // array of pointers to strings
  int ci = 0;
  std::chrono::steady_clock::time_point begin = std::chrono::steady_clock::now();

  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    stringPtrArray[idx] = new std::string(buffer);
    if (chosen == idx) {
      chosenString = *stringPtrArray[idx]; // copy constructor
    }
  }
  // Storage time?
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();

  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Storage: Time difference = 34[ms]
Storage: Time difference = 34292[µs]
Storage: Time difference = 34292787[ns]
*/





  // OPTION 1a: Retrieve by key name

  // Pull back a random one by name (akin to a search by the key string in a K-V store)
  begin = std::chrono::steady_clock::now();
  int retrievedIdx = -1;
  for (int idx = 0;idx < storeSize;idx++) {
    if (chosenString == *stringPtrArray[idx]) {
      retrievedIdx = idx;
      break; // end loop early
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "Value at 0: " << *stringPtrArray[0] << std::endl;
  std::cout << "Value at 1: " << *stringPtrArray[1] << std::endl;
  std::cout << "Retrieved         : " << chosenString << " at index: " << retrievedIdx << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Value at 0: lrfkqyuqfjkxyqvnrtysfrzrmzlygfve
Value at 1: ulqfpdbhlqdqrrcrwdnxeuoqqeklaitg
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq at index: 48751
Retrieval by name : Time difference = 4[ms]
Retrieval by name : Time difference = 4351[µs]
Retrieval by name : Time difference = 4351301[ns]
*/





  // OPTION 1b: Retrieve by known key index (position)

  // Pull back a random one by index, and record the time taken
  std::string retrieved;
  begin = std::chrono::steady_clock::now();
  retrieved = *stringPtrArray[chosen];
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved         : " << retrieved << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq
Retrieval by index: Time difference = 0[ms]
Retrieval by index: Time difference = 0[µs]
Retrieval by index: Time difference = 935[ns]
*/








  // Solution formulation...

  // QUESTION: What is more performant: Fetch by name, or fetch by index?
  //   ANSWER: Index takes 1/263 of the time! It's *MUCH* faster!
  // QUESTION: If we hash the name and use this hash value as the index, could we improve things?
  //   ANSWER: Probably, yes
  //    QUESTION: Could the calculation of the hash take longer than retrieval of the value by name? What does this imply?
  //      ANSWER: Possibly, if not many keys or key names were all short. This means it will be slower than by name! ;o(









  // OPTION 2: Store by the hash of a key in an efficient (O log(n)) unordered map
  // C++11 reference https://www.cplusplus.com/reference/unordered_map/unordered_map/

  // Now do the same for a hash table variant
  // Hash table -> Convert type (string) to a hash number, store data at hash index, and retrieve by hash index
  // Use built in hash map type in C++ for this
  std::unordered_map<std::string,std::string> keyValueStore;
  std::string key;
  std::string randomValue = "wibble"; // doesn't matter - we're test key speed
  begin = std::chrono::steady_clock::now();
  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    key = std::string(buffer);
    keyValueStore.insert({key,randomValue}); // C++11, creates a std::pair<string,string>
    if (chosen == idx) {
      chosenString = key; // copy constructor
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
MapStore: Time difference = 103[ms]
MapStore: Time difference = 103129[µs]
MapStore: Time difference = 103129217[ns]
*/





  // OPTION 2: Retrieval time
  begin = std::chrono::steady_clock::now();
  auto kvPair = keyValueStore.find(chosenString);
  std::string retKey = kvPair->first; // first is key
  std::string retValue = kvPair->second; // second is value
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved key    : " << retKey << " with value: " << retValue << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved key    : yfuhybliokgniztyfuquvlaleaznpcsr with value: wibble
Retrieve from Map: Time difference = 0[ms]
Retrieve from Map: Time difference = 1[µs]
Retrieve from Map: Time difference = 1236[ns]
*/




  // CONCLUSIONS???

  // QUESTION: How did storage speeds compare amongst the two mechanisms?
  //   ANSWER: Hash method is 3 times slower! 103ms vs 34ms. "I thought you said this would be BETTER to use!?!" (well...)
  // QUESTION: How did retrieval speeds compare against the three mechanisms (fetch by name, by index (pre-computed hash), and by hash)?
  //   ANSWER: name: 4351301ns, index: 935ns, hash: 1249ns
  //           i.e. Retrieval was 1/3483 the time vs by name, but 1.33 times longer than a raw index
  //           BUT raw C++ in memory indexes are the quickest you're going to get - seek to memory location
  //            - You can't guarantee a large chunk of contiguous memory is given to your database server as
  //              most Operating Systems randomise memory locations for security, so you can't use raw memory.
  //           CONCLUSION: Hash based map implementations are insanely quick - we should totally use hashes and in-memory unordered maps
}